

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

void __thiscall
duckdb::WindowBoundariesState::Bounds
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,
          optional_ptr<duckdb::WindowCursor,_true> range,idx_t count,
          WindowInputExpression *boundary_start,WindowInputExpression *boundary_end,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  idx_t iVar1;
  optional_ptr<duckdb::WindowCursor,_true> range_00;
  size_type sVar2;
  idx_t row_idx_00;
  ValidityMask *partition_mask_00;
  key_type local_48 [8];
  WindowInputExpression *local_40;
  optional_ptr<duckdb::WindowCursor,_true> local_38;
  
  partition_mask_00 = (ValidityMask *)count;
  local_40 = boundary_start;
  local_38.ptr = range.ptr;
  DataChunk::Reset(bounds);
  iVar1 = this->next_pos;
  if (iVar1 != row_idx) {
    this->next_pos = row_idx;
  }
  local_48[7] = 0;
  sVar2 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,local_48 + 7);
  if (sVar2 != 0) {
    partition_mask_00 = (ValidityMask *)(ulong)(iVar1 != row_idx);
    PartitionBegin(this,bounds,row_idx,count,iVar1 != row_idx,partition_mask);
  }
  local_48[6] = 1;
  sVar2 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,local_48 + 6);
  if (sVar2 != 0) {
    partition_mask_00 = (ValidityMask *)(ulong)(iVar1 != row_idx);
    PartitionEnd(this,bounds,row_idx,count,iVar1 != row_idx,partition_mask);
  }
  local_48[5] = 2;
  sVar2 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,local_48 + 5);
  range_00.ptr = local_38.ptr;
  if (sVar2 != 0) {
    partition_mask_00 = (ValidityMask *)(ulong)(iVar1 != row_idx);
    PeerBegin(this,bounds,row_idx,count,iVar1 != row_idx,partition_mask,order_mask);
  }
  local_48[4] = 3;
  sVar2 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,local_48 + 4);
  if (sVar2 != 0) {
    PeerEnd(this,bounds,row_idx_00,count,partition_mask_00,order_mask);
  }
  local_48[3] = 4;
  sVar2 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,local_48 + 3);
  if (sVar2 != 0) {
    ValidBegin(this,bounds,row_idx,count,iVar1 != row_idx,partition_mask,order_mask,range_00);
  }
  local_48[2] = 5;
  sVar2 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,local_48 + 2);
  if (sVar2 != 0) {
    ValidEnd(this,bounds,row_idx,count,iVar1 != row_idx,partition_mask,order_mask,range_00);
  }
  local_48[1] = 6;
  sVar2 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,local_48 + 1);
  if (sVar2 != 0) {
    FrameBegin(this,bounds,row_idx,count,local_40,order_mask,range_00);
  }
  local_48[0] = FRAME_END;
  sVar2 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,local_48);
  if (sVar2 != 0) {
    FrameEnd(this,bounds,row_idx,count,boundary_end,order_mask,range_00);
  }
  this->next_pos = this->next_pos + count;
  bounds->count = count;
  return;
}

Assistant:

void WindowBoundariesState::Bounds(DataChunk &bounds, idx_t row_idx, optional_ptr<WindowCursor> range,
                                   const idx_t count, WindowInputExpression &boundary_start,
                                   WindowInputExpression &boundary_end, const ValidityMask &partition_mask,
                                   const ValidityMask &order_mask) {
	bounds.Reset();
	D_ASSERT(bounds.ColumnCount() == 8);

	//	Have we jumped from the previous position?
	const auto is_jump = (next_pos != row_idx);
	if (is_jump) {
		next_pos = row_idx;
	}

	if (required.count(PARTITION_BEGIN)) {
		PartitionBegin(bounds, row_idx, count, is_jump, partition_mask);
	}
	if (required.count(PARTITION_END)) {
		PartitionEnd(bounds, row_idx, count, is_jump, partition_mask);
	}
	if (required.count(PEER_BEGIN)) {
		PeerBegin(bounds, row_idx, count, is_jump, partition_mask, order_mask);
	}
	if (required.count(PEER_END)) {
		PeerEnd(bounds, row_idx, count, partition_mask, order_mask);
	}
	if (required.count(VALID_BEGIN)) {
		ValidBegin(bounds, row_idx, count, is_jump, partition_mask, order_mask, range);
	}
	if (required.count(VALID_END)) {
		ValidEnd(bounds, row_idx, count, is_jump, partition_mask, order_mask, range);
	}
	if (required.count(FRAME_BEGIN)) {
		FrameBegin(bounds, row_idx, count, boundary_start, order_mask, range);
	}
	if (required.count(FRAME_END)) {
		FrameEnd(bounds, row_idx, count, boundary_end, order_mask, range);
	}
	next_pos += count;

	bounds.SetCardinality(count);
}